

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>::operator+=
          (uintwide_t<64U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  iterator puVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  limb_type carry_1;
  limb_type carry;
  uintwide_t<24U,_unsigned_char,_void,_false> self;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  _self = (array<unsigned_int,_2UL> *)other;
  if (this == (uintwide_t<64U,_unsigned_int,_void,_false> *)other) {
    _carry_1 = *(value_type_conflict (*) [2])other;
    puVar1 = detail::array_detail::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)this)
    ;
    puVar2 = detail::array_detail::array<unsigned_int,_2UL>::cbegin
                       ((array<unsigned_int,_2UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_2UL>::cbegin
                       ((array<unsigned_int,_2UL> *)&carry_1);
    uintwide_t<64u,unsigned_int,void,false>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,2,0);
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)this)
    ;
    puVar2 = detail::array_detail::array<unsigned_int,_2UL>::cbegin
                       ((array<unsigned_int,_2UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_2UL>::cbegin(_self);
    uintwide_t<64u,unsigned_int,void,false>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,2,0);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }